

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O3

void Ivy_ManHaigStop(Ivy_Man_t *p)

{
  void *pvVar1;
  void *__ptr;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    pvVar1 = p->pHaig->pData;
    __ptr = *(void **)((long)pvVar1 + 8);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    free(pvVar1);
    Ivy_ManStop(p->pHaig);
    p->pHaig = (Ivy_Man_t *)0x0;
    lVar3 = (long)p->vObjs->nSize;
    if (0 < lVar3) {
      ppvVar2 = p->vObjs->pArray;
      lVar4 = 0;
      do {
        pvVar1 = ppvVar2[lVar4];
        if (pvVar1 != (void *)0x0) {
          *(undefined8 *)((long)pvVar1 + 0x48) = 0;
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    return;
  }
  __assert_fail("p->pHaig != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                ,0xa3,"void Ivy_ManHaigStop(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManHaigStop( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig != NULL );
    Vec_IntFree( (Vec_Int_t *)p->pHaig->pData );
    Ivy_ManStop( p->pHaig );
    p->pHaig = NULL;
    // remove dangling pointers to the HAIG objects
    Ivy_ManForEachObj( p, pObj, i )
        pObj->pEquiv = NULL;
}